

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O3

Value * soul::generateWaveform(Value *__return_storage_ptr__,Annotation *annotation)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  int64_t iVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  Triangle g_2;
  Sine g;
  string local_c0;
  string local_a0;
  double local_80;
  double local_78;
  string local_70;
  string local_50;
  
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"sinewave","");
  bVar2 = Annotation::getBool(annotation,&local_a0,false);
  bVar3 = true;
  if (!bVar2) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"sine","");
    bVar3 = Annotation::getBool(annotation,&local_c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (bVar3 == false) {
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"sawtooth","");
    bVar2 = Annotation::getBool(annotation,&local_a0,false);
    bVar3 = true;
    if (!bVar2) {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"saw","");
      bVar3 = Annotation::getBool(annotation,&local_c0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (bVar3 == false) {
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"triangle","");
      bVar2 = Annotation::getBool(annotation,&local_a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        local_a0._M_string_length = 0;
        local_a0.field_2._M_allocated_capacity = 0;
        local_a0._M_dataplus._M_p = (pointer)&PTR__Generator_002d0cc0;
        local_a0.field_2._8_8_ = 0x3ff0000000000000;
        local_c0.field_2._M_allocated_capacity = 0x636e657571657266;
        local_c0.field_2._8_2_ = 0x79;
        local_c0._M_string_length = 9;
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        local_78 = Annotation::getDouble(annotation,&local_c0,0.0);
        local_70._M_string_length = 4;
        local_70.field_2._M_allocated_capacity._0_5_ = 0x65746172;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_80 = Annotation::getDouble(annotation,&local_70,0.0);
        local_50.field_2._M_allocated_capacity = 0x656d6172466d756e;
        local_50.field_2._8_2_ = 0x73;
        local_50._M_string_length = 9;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        iVar4 = Annotation::getInt64(annotation,&local_50,0);
        generateWaveform(__return_storage_ptr__,local_78,local_80,iVar4,(Generator *)&local_a0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        uVar5 = local_c0.field_2._M_allocated_capacity;
        _Var6._M_p = local_c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_0019e52a;
      }
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"squarewave","");
      bVar2 = Annotation::getBool(annotation,&local_a0,false);
      bVar3 = true;
      if (!bVar2) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"square","");
        bVar3 = Annotation::getBool(annotation,&local_c0,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (bVar3 == false) {
        (__return_storage_ptr__->packedData).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->packedData).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->packedData).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->dictionary).super_StringDictionary._vptr_StringDictionary =
             (_func_int **)&PTR__SimpleStringDictionary_002cab48;
        (__return_storage_ptr__->value).type.content.object = (Object *)0x0;
        (__return_storage_ptr__->value).type.allocator = (Allocator *)0x0;
        (__return_storage_ptr__->value).data = (uint8_t *)0x0;
        (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->dictionary).strings.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish + 1) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->dictionary).strings.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 1) = 0;
        (__return_storage_ptr__->value).stringDictionary =
             &(__return_storage_ptr__->dictionary).super_StringDictionary;
        return __return_storage_ptr__;
      }
      local_50._M_string_length = 0;
      local_50.field_2._M_allocated_capacity = 0;
      local_50._M_dataplus._M_p = (pointer)&PTR__Generator_002d0d18;
      local_a0.field_2._M_allocated_capacity = 0x636e657571657266;
      local_a0.field_2._8_2_ = 0x79;
      local_a0._M_string_length = 9;
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      local_78 = Annotation::getDouble(annotation,&local_a0,0.0);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_c0._M_string_length = 4;
      local_c0.field_2._M_allocated_capacity._0_5_ = 0x65746172;
      local_80 = Annotation::getDouble(annotation,&local_c0,0.0);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70.field_2._M_allocated_capacity = 0x656d6172466d756e;
      local_70.field_2._8_2_ = 0x73;
      local_70._M_string_length = 9;
      iVar4 = Annotation::getInt64(annotation,&local_70,0);
      generateWaveform(__return_storage_ptr__,local_78,local_80,iVar4,(Generator *)&local_50,2);
    }
    else {
      local_50._M_string_length = 0;
      local_50.field_2._M_allocated_capacity = 0;
      local_50._M_dataplus._M_p = (pointer)&PTR__Generator_002d0c68;
      local_a0.field_2._M_allocated_capacity = 0x636e657571657266;
      local_a0.field_2._8_2_ = 0x79;
      local_a0._M_string_length = 9;
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      local_78 = Annotation::getDouble(annotation,&local_a0,0.0);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_c0._M_string_length = 4;
      local_c0.field_2._M_allocated_capacity._0_5_ = 0x65746172;
      local_80 = Annotation::getDouble(annotation,&local_c0,0.0);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70.field_2._M_allocated_capacity = 0x656d6172466d756e;
      local_70.field_2._8_2_ = 0x73;
      local_70._M_string_length = 9;
      iVar4 = Annotation::getInt64(annotation,&local_70,0);
      generateWaveform(__return_storage_ptr__,local_78,local_80,iVar4,(Generator *)&local_50,2);
    }
  }
  else {
    local_50._M_string_length = 0;
    local_50.field_2._M_allocated_capacity = 0;
    local_50._M_dataplus._M_p = (pointer)&PTR__Generator_002d0c18;
    local_a0.field_2._M_allocated_capacity = 0x636e657571657266;
    local_a0.field_2._8_2_ = 0x79;
    local_a0._M_string_length = 9;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    local_78 = Annotation::getDouble(annotation,&local_a0,0.0);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 4;
    local_c0.field_2._M_allocated_capacity._0_5_ = 0x65746172;
    local_80 = Annotation::getDouble(annotation,&local_c0,0.0);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70.field_2._M_allocated_capacity = 0x656d6172466d756e;
    local_70.field_2._8_2_ = 0x73;
    local_70._M_string_length = 9;
    iVar4 = Annotation::getInt64(annotation,&local_70,0);
    generateWaveform(__return_storage_ptr__,local_78,local_80,iVar4,(Generator *)&local_50,1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  uVar5 = local_a0.field_2._M_allocated_capacity;
  _Var6._M_p = local_a0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == paVar1) {
    return __return_storage_ptr__;
  }
LAB_0019e52a:
  operator_delete(_Var6._M_p,uVar5 + 1);
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value generateWaveform (const Annotation& annotation)
{
    if (annotation.getBool ("sinewave") || annotation.getBool ("sine"))
        return generateWaveform<WaveGenerators::Sine> (annotation, 1);

    if (annotation.getBool ("sawtooth") || annotation.getBool ("saw"))
        return generateWaveform<WaveGenerators::Saw> (annotation, 2);

    if (annotation.getBool ("triangle"))
        return generateWaveform<WaveGenerators::Triangle> (annotation, 2);

    if (annotation.getBool ("squarewave") || annotation.getBool ("square"))
        return generateWaveform<WaveGenerators::Square> (annotation, 2);

    return {};
}